

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

size_t ZSTD_HcFindBestMatch_dictMatchState_selectMLS
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iLimit,size_t *offsetPtr)

{
  uint uVar1;
  uint uVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  ZSTD_matchState_t *pZVar5;
  BYTE *pBVar6;
  BYTE *pBVar7;
  U32 *pUVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  U32 UVar13;
  U32 UVar14;
  size_t sVar15;
  BYTE *pBVar16;
  uint local_340;
  uint local_338;
  uint local_328;
  uint local_320;
  uint local_310;
  uint local_308;
  size_t *offsetPtr_local;
  BYTE *iLimit_local;
  BYTE *ip_local;
  ZSTD_matchState_t *ms_local;
  BYTE *match_8;
  size_t currentMl_5;
  U32 dmsMinChain_2;
  U32 dmsIndexDelta_2;
  U32 dmsSize_2;
  BYTE *dmsEnd_2;
  BYTE *dmsBase_2;
  U32 dmsLowestIndex_2;
  U32 dmsChainMask_2;
  U32 dmsChainSize_2;
  U32 *dmsChainTable_2;
  ZSTD_matchState_t *dms_2;
  BYTE *match_7;
  BYTE *match_6;
  size_t currentMl_4;
  BYTE *pBStack_268;
  U32 matchIndex_2;
  size_t ml_2;
  U32 nbAttempts_2;
  U32 minChain_2;
  U32 current_2;
  U32 lowLimit_2;
  BYTE *dictEnd_2;
  BYTE *prefixStart_2;
  U32 dictLimit_2;
  BYTE *dictBase_2;
  BYTE *base_2;
  U32 chainMask_2;
  U32 chainSize_2;
  U32 *chainTable_2;
  ZSTD_compressionParameters *cParams_2;
  BYTE *match_5;
  size_t currentMl_3;
  U32 dmsMinChain_1;
  U32 dmsIndexDelta_1;
  U32 dmsSize_1;
  BYTE *dmsEnd_1;
  BYTE *dmsBase_1;
  U32 dmsLowestIndex_1;
  U32 dmsChainMask_1;
  U32 dmsChainSize_1;
  U32 *dmsChainTable_1;
  ZSTD_matchState_t *dms_1;
  BYTE *match_4;
  BYTE *match_3;
  size_t currentMl_2;
  BYTE *pBStack_178;
  U32 matchIndex_1;
  size_t ml_1;
  U32 nbAttempts_1;
  U32 minChain_1;
  U32 current_1;
  U32 lowLimit_1;
  BYTE *dictEnd_1;
  BYTE *prefixStart_1;
  U32 dictLimit_1;
  BYTE *dictBase_1;
  BYTE *base_1;
  U32 chainMask_1;
  U32 chainSize_1;
  U32 *chainTable_1;
  ZSTD_compressionParameters *cParams_1;
  BYTE *match_2;
  size_t currentMl_1;
  U32 dmsMinChain;
  U32 dmsIndexDelta;
  U32 dmsSize;
  BYTE *dmsEnd;
  BYTE *dmsBase;
  U32 dmsLowestIndex;
  U32 dmsChainMask;
  U32 dmsChainSize;
  U32 *dmsChainTable;
  ZSTD_matchState_t *dms;
  BYTE *match_1;
  BYTE *match;
  size_t currentMl;
  BYTE *pBStack_88;
  U32 matchIndex;
  size_t ml;
  U32 nbAttempts;
  U32 minChain;
  U32 current;
  U32 lowLimit;
  BYTE *dictEnd;
  BYTE *prefixStart;
  U32 dictLimit;
  BYTE *dictBase;
  BYTE *base;
  U32 chainMask;
  U32 chainSize;
  U32 *chainTable;
  ZSTD_compressionParameters *cParams;
  
  uVar1 = (ms->cParams).minMatch;
  iVar9 = (int)ip;
  if (uVar1 != 4) {
    if (uVar1 == 5) {
      pUVar3 = ms->chainTable;
      uVar10 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
      pBVar4 = (ms->window).base;
      uVar1 = (ms->window).dictLimit;
      uVar2 = (ms->window).lowLimit;
      uVar11 = iVar9 - (int)pBVar4;
      if (uVar10 < uVar11) {
        local_320 = uVar11 - uVar10;
      }
      else {
        local_320 = 0;
      }
      ml_1._0_4_ = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      pBStack_178 = (BYTE *)0x3;
      for (currentMl_2._4_4_ = ZSTD_insertAndFindFirstIndex_internal(ms,&ms->cParams,ip,5);
          uVar2 < currentMl_2._4_4_ && (int)ml_1 != 0;
          currentMl_2._4_4_ = pUVar3[currentMl_2._4_4_ & uVar10 - 1]) {
        match_3 = (BYTE *)0x0;
        if ((pBVar4 + currentMl_2._4_4_)[(long)pBStack_178] == ip[(long)pBStack_178]) {
          match_3 = (BYTE *)ZSTD_count(ip,pBVar4 + currentMl_2._4_4_,iLimit);
        }
        if (pBStack_178 < match_3) {
          pBStack_178 = match_3;
          *offsetPtr = (ulong)((uVar11 - currentMl_2._4_4_) + 2);
          if (ip + (long)match_3 == iLimit) break;
        }
        if (currentMl_2._4_4_ <= local_320) break;
        ml_1._0_4_ = (int)ml_1 + -1;
      }
      pZVar5 = ms->dictMatchState;
      pUVar3 = pZVar5->chainTable;
      uVar10 = 1 << ((byte)(pZVar5->cParams).chainLog & 0x1f);
      uVar2 = (pZVar5->window).dictLimit;
      pBVar6 = (pZVar5->window).base;
      pBVar7 = (pZVar5->window).nextSrc;
      uVar12 = (int)pBVar7 - (int)pBVar6;
      if (uVar10 < uVar12) {
        local_328 = uVar12 - uVar10;
      }
      else {
        local_328 = 0;
      }
      pUVar8 = pZVar5->hashTable;
      sVar15 = ZSTD_hashPtr(ip,(pZVar5->cParams).hashLog,5);
      currentMl_2._4_4_ = pUVar8[sVar15];
      while( true ) {
        if (currentMl_2._4_4_ <= uVar2 || (int)ml_1 == 0) {
          return (size_t)pBStack_178;
        }
        match_5 = (BYTE *)0x0;
        pBVar16 = pBVar6 + currentMl_2._4_4_;
        UVar13 = MEM_read32(pBVar16);
        UVar14 = MEM_read32(ip);
        if (UVar13 == UVar14) {
          sVar15 = ZSTD_count_2segments(ip + 4,pBVar16 + 4,iLimit,pBVar7,pBVar4 + uVar1);
          match_5 = (BYTE *)(sVar15 + 4);
        }
        if (pBStack_178 < match_5) {
          pBStack_178 = match_5;
          *offsetPtr = (ulong)((uVar11 - (currentMl_2._4_4_ + (uVar1 - uVar12))) + 2);
          if (ip + (long)match_5 == iLimit) {
            return (size_t)match_5;
          }
        }
        if (currentMl_2._4_4_ <= local_328) break;
        currentMl_2._4_4_ = pUVar3[currentMl_2._4_4_ & uVar10 - 1];
        ml_1._0_4_ = (int)ml_1 + -1;
      }
      return (size_t)pBStack_178;
    }
    if (uVar1 - 6 < 2) {
      pUVar3 = ms->chainTable;
      uVar10 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
      pBVar4 = (ms->window).base;
      uVar1 = (ms->window).dictLimit;
      uVar2 = (ms->window).lowLimit;
      uVar11 = iVar9 - (int)pBVar4;
      if (uVar10 < uVar11) {
        local_338 = uVar11 - uVar10;
      }
      else {
        local_338 = 0;
      }
      ml_2._0_4_ = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      pBStack_268 = (BYTE *)0x3;
      for (currentMl_4._4_4_ = ZSTD_insertAndFindFirstIndex_internal(ms,&ms->cParams,ip,6);
          uVar2 < currentMl_4._4_4_ && (int)ml_2 != 0;
          currentMl_4._4_4_ = pUVar3[currentMl_4._4_4_ & uVar10 - 1]) {
        match_6 = (BYTE *)0x0;
        if ((pBVar4 + currentMl_4._4_4_)[(long)pBStack_268] == ip[(long)pBStack_268]) {
          match_6 = (BYTE *)ZSTD_count(ip,pBVar4 + currentMl_4._4_4_,iLimit);
        }
        if (pBStack_268 < match_6) {
          pBStack_268 = match_6;
          *offsetPtr = (ulong)((uVar11 - currentMl_4._4_4_) + 2);
          if (ip + (long)match_6 == iLimit) break;
        }
        if (currentMl_4._4_4_ <= local_338) break;
        ml_2._0_4_ = (int)ml_2 + -1;
      }
      pZVar5 = ms->dictMatchState;
      pUVar3 = pZVar5->chainTable;
      uVar10 = 1 << ((byte)(pZVar5->cParams).chainLog & 0x1f);
      uVar2 = (pZVar5->window).dictLimit;
      pBVar6 = (pZVar5->window).base;
      pBVar7 = (pZVar5->window).nextSrc;
      uVar12 = (int)pBVar7 - (int)pBVar6;
      if (uVar10 < uVar12) {
        local_340 = uVar12 - uVar10;
      }
      else {
        local_340 = 0;
      }
      pUVar8 = pZVar5->hashTable;
      sVar15 = ZSTD_hashPtr(ip,(pZVar5->cParams).hashLog,6);
      currentMl_4._4_4_ = pUVar8[sVar15];
      while( true ) {
        if (currentMl_4._4_4_ <= uVar2 || (int)ml_2 == 0) {
          return (size_t)pBStack_268;
        }
        match_8 = (BYTE *)0x0;
        pBVar16 = pBVar6 + currentMl_4._4_4_;
        UVar13 = MEM_read32(pBVar16);
        UVar14 = MEM_read32(ip);
        if (UVar13 == UVar14) {
          sVar15 = ZSTD_count_2segments(ip + 4,pBVar16 + 4,iLimit,pBVar7,pBVar4 + uVar1);
          match_8 = (BYTE *)(sVar15 + 4);
        }
        if (pBStack_268 < match_8) {
          pBStack_268 = match_8;
          *offsetPtr = (ulong)((uVar11 - (currentMl_4._4_4_ + (uVar1 - uVar12))) + 2);
          if (ip + (long)match_8 == iLimit) {
            return (size_t)match_8;
          }
        }
        if (currentMl_4._4_4_ <= local_340) break;
        currentMl_4._4_4_ = pUVar3[currentMl_4._4_4_ & uVar10 - 1];
        ml_2._0_4_ = (int)ml_2 + -1;
      }
      return (size_t)pBStack_268;
    }
  }
  pUVar3 = ms->chainTable;
  uVar10 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
  pBVar4 = (ms->window).base;
  uVar1 = (ms->window).dictLimit;
  uVar2 = (ms->window).lowLimit;
  uVar11 = iVar9 - (int)pBVar4;
  if (uVar10 < uVar11) {
    local_308 = uVar11 - uVar10;
  }
  else {
    local_308 = 0;
  }
  ml._0_4_ = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  pBStack_88 = (BYTE *)0x3;
  for (currentMl._4_4_ = ZSTD_insertAndFindFirstIndex_internal(ms,&ms->cParams,ip,4);
      uVar2 < currentMl._4_4_ && (int)ml != 0;
      currentMl._4_4_ = pUVar3[currentMl._4_4_ & uVar10 - 1]) {
    match = (BYTE *)0x0;
    if ((pBVar4 + currentMl._4_4_)[(long)pBStack_88] == ip[(long)pBStack_88]) {
      match = (BYTE *)ZSTD_count(ip,pBVar4 + currentMl._4_4_,iLimit);
    }
    if (pBStack_88 < match) {
      pBStack_88 = match;
      *offsetPtr = (ulong)((uVar11 - currentMl._4_4_) + 2);
      if (ip + (long)match == iLimit) break;
    }
    if (currentMl._4_4_ <= local_308) break;
    ml._0_4_ = (int)ml + -1;
  }
  pZVar5 = ms->dictMatchState;
  pUVar3 = pZVar5->chainTable;
  uVar10 = 1 << ((byte)(pZVar5->cParams).chainLog & 0x1f);
  uVar2 = (pZVar5->window).dictLimit;
  pBVar6 = (pZVar5->window).base;
  pBVar7 = (pZVar5->window).nextSrc;
  uVar12 = (int)pBVar7 - (int)pBVar6;
  if (uVar10 < uVar12) {
    local_310 = uVar12 - uVar10;
  }
  else {
    local_310 = 0;
  }
  pUVar8 = pZVar5->hashTable;
  sVar15 = ZSTD_hashPtr(ip,(pZVar5->cParams).hashLog,4);
  currentMl._4_4_ = pUVar8[sVar15];
  while( true ) {
    if (currentMl._4_4_ <= uVar2 || (int)ml == 0) {
      return (size_t)pBStack_88;
    }
    match_2 = (BYTE *)0x0;
    pBVar16 = pBVar6 + currentMl._4_4_;
    UVar13 = MEM_read32(pBVar16);
    UVar14 = MEM_read32(ip);
    if (UVar13 == UVar14) {
      sVar15 = ZSTD_count_2segments(ip + 4,pBVar16 + 4,iLimit,pBVar7,pBVar4 + uVar1);
      match_2 = (BYTE *)(sVar15 + 4);
    }
    if (pBStack_88 < match_2) {
      pBStack_88 = match_2;
      *offsetPtr = (ulong)((uVar11 - (currentMl._4_4_ + (uVar1 - uVar12))) + 2);
      if (ip + (long)match_2 == iLimit) {
        return (size_t)match_2;
      }
    }
    if (currentMl._4_4_ <= local_310) break;
    currentMl._4_4_ = pUVar3[currentMl._4_4_ & uVar10 - 1];
    ml._0_4_ = (int)ml + -1;
  }
  return (size_t)pBStack_88;
}

Assistant:

static size_t ZSTD_HcFindBestMatch_dictMatchState_selectMLS (
                        ZSTD_matchState_t* ms,
                        const BYTE* ip, const BYTE* const iLimit,
                        size_t* offsetPtr)
{
    switch(ms->cParams.minMatch)
    {
    default : /* includes case 3 */
    case 4 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 4, ZSTD_dictMatchState);
    case 5 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 5, ZSTD_dictMatchState);
    case 7 :
    case 6 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 6, ZSTD_dictMatchState);
    }
}